

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adx.c
# Opt level: O1

TA_RetCode
rangeTestFunction(TA_Integer startIdx,TA_Integer endIdx,TA_Real *outputBuffer,
                 TA_Integer *outputBufferInt,TA_Integer *outBegIdx,TA_Integer *outNbElement,
                 TA_Integer *lookback,void *opaqueData,uint outputNb,uint *isOutputInteger)

{
  TA_RetCode TVar1;
  int iVar2;
  
  *isOutputInteger = 0;
  if (*(int *)(*opaqueData + 0x10) == 0) {
    TVar1 = TA_TRANGE(startIdx,endIdx,*(double **)((long)opaqueData + 8),
                      *(double **)((long)opaqueData + 0x10),*(double **)((long)opaqueData + 0x18),
                      outBegIdx,outNbElement,outputBuffer);
    iVar2 = TA_TRANGE_Lookback();
  }
  else {
    TVar1 = TA_ATR(startIdx,endIdx,*(double **)((long)opaqueData + 8),
                   *(double **)((long)opaqueData + 0x10),*(double **)((long)opaqueData + 0x18),
                   *(int *)(*opaqueData + 0x14),outBegIdx,outNbElement,outputBuffer);
    iVar2 = TA_ATR_Lookback(*(int *)(*opaqueData + 0x14));
  }
  *lookback = iVar2;
  return TVar1;
}

Assistant:

static TA_RetCode rangeTestFunction( TA_Integer    startIdx,
                                     TA_Integer    endIdx,
                                     TA_Real      *outputBuffer,
                                     TA_Integer   *outputBufferInt,
                                     TA_Integer   *outBegIdx,
                                     TA_Integer   *outNbElement,
                                     TA_Integer   *lookback,
                                     void         *opaqueData,
                                     unsigned int  outputNb,
                                     unsigned int *isOutputInteger )
{
   TA_RetCode retCode;
   TA_RangeTestParam *testParam;

   (void)outputNb;
   (void)outputBufferInt;

   *isOutputInteger = 0;

   testParam = (TA_RangeTestParam *)opaqueData;

   switch( testParam->test->id )
   {
   case TST_MINUS_DM:
      retCode = TA_MINUS_DM( startIdx,
                             endIdx,
                             testParam->high,
                             testParam->low,
                             testParam->test->optInTimePeriod,
                             outBegIdx,
                             outNbElement,
                             outputBuffer );

      *lookback = TA_MINUS_DM_Lookback( testParam->test->optInTimePeriod );
      break;

   case TST_MINUS_DI:
      retCode = TA_MINUS_DI( startIdx,
                             endIdx,
                             testParam->high,
                             testParam->low,
                             testParam->close,
                             testParam->test->optInTimePeriod,
                             outBegIdx,
                             outNbElement,
                             outputBuffer );

      *lookback = TA_MINUS_DI_Lookback( testParam->test->optInTimePeriod );
      break;

   case TST_DX:
      retCode = TA_DX( startIdx,
                       endIdx,
                       testParam->high,
                       testParam->low,
                       testParam->close,
                       testParam->test->optInTimePeriod,
                       outBegIdx,
                       outNbElement,
                       outputBuffer );

      *lookback = TA_DX_Lookback( testParam->test->optInTimePeriod );
      break;

   case TST_ADX:
      retCode = TA_ADX( startIdx,
                        endIdx,
                        testParam->high,
                        testParam->low,
                        testParam->close,
                        testParam->test->optInTimePeriod,
                        outBegIdx,
                        outNbElement,
                        outputBuffer );

      *lookback = TA_ADX_Lookback( testParam->test->optInTimePeriod );
      break;

   case TST_PLUS_DM:
      retCode = TA_PLUS_DM( startIdx,
                            endIdx,
                            testParam->high,
                            testParam->low,
                            testParam->test->optInTimePeriod,
                            outBegIdx,
                            outNbElement,
                            outputBuffer );

      *lookback = TA_PLUS_DM_Lookback( testParam->test->optInTimePeriod );
      break;

   case TST_PLUS_DI:
      retCode = TA_PLUS_DI( startIdx,
                            endIdx,
                            testParam->high,
                            testParam->low,
                            testParam->close,
                            testParam->test->optInTimePeriod,
                            outBegIdx,
                            outNbElement,
                            outputBuffer );

      *lookback = TA_PLUS_DI_Lookback( testParam->test->optInTimePeriod );
      break;

   case TST_ADXR:
      retCode = TA_ADXR( startIdx,
                         endIdx,
                         testParam->high,
                         testParam->low,
                         testParam->close,
                         testParam->test->optInTimePeriod,
                         outBegIdx,
                         outNbElement,
                         outputBuffer );

      *lookback = TA_ADXR_Lookback( testParam->test->optInTimePeriod );
      break;
   default:
      retCode = TA_BAD_PARAM;
   }

   return retCode;
}